

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<std::function<void_()>,_0UL> * __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::operator=
          (SmallVector<std::function<void_()>,_0UL> *this,
          SmallVector<std::function<void_()>,_0UL> *other)

{
  ulong local_28;
  size_t i;
  SmallVector<std::function<void_()>,_0UL> *other_local;
  SmallVector<std::function<void_()>,_0UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<std::function<void_()>_>).buffer_size);
    for (local_28 = 0; local_28 < (other->super_VectorView<std::function<void_()>_>).buffer_size;
        local_28 = local_28 + 1) {
      ::std::function<void_()>::function
                ((this->super_VectorView<std::function<void_()>_>).ptr + local_28,
                 (other->super_VectorView<std::function<void_()>_>).ptr + local_28);
    }
    (this->super_VectorView<std::function<void_()>_>).buffer_size =
         (other->super_VectorView<std::function<void_()>_>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}